

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineInterfaceObject.cpp
# Opt level: O1

ScriptFunction *
Js::EngineInterfaceObject::CreateLibraryCodeScriptFunction
          (ScriptFunction *scriptFunction,JavascriptString *displayName,bool isConstructor,
          bool isJsBuiltIn,bool isPublic)

{
  Type *pTVar1;
  Type TVar2;
  FunctionInfo *pFVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  charcount_t cVar7;
  BOOL BVar8;
  charcount_t cVar9;
  FunctionProxy *pFVar10;
  undefined4 *puVar11;
  DynamicTypeHandler *typeHandler;
  undefined4 extraout_var;
  char16_t *pcVar12;
  ParseableFunctionInfo *pPVar13;
  JavascriptString *this;
  FunctionBody *pFVar14;
  undefined7 in_register_00000009;
  char cVar15;
  undefined4 uVar16;
  ulong uVar17;
  char16_t *content;
  Var local_48;
  Var existingName;
  undefined4 local_34;
  char16_t *string;
  
  pFVar10 = ScriptFunction::GetFunctionProxy(scriptFunction);
  if ((pFVar10->field_0x44 & 4) != 0) {
    return scriptFunction;
  }
  uVar16 = (undefined4)CONCAT71(in_register_00000009,isJsBuiltIn);
  pFVar3 = (scriptFunction->super_ScriptFunctionBase).super_JavascriptFunction.functionInfo.ptr;
  existingName = (((((scriptFunction->super_ScriptFunctionBase).super_JavascriptFunction.
                     super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr;
  TVar2 = pFVar3->attributes;
  local_34 = uVar16;
  if (isConstructor) {
    if ((TVar2 & ErrorOnNew) != None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                  ,0x11d,
                                  "((scriptFunction->GetFunctionInfo()->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0)"
                                  ,"Why is the function not constructable by default?");
      if (!bVar5) goto LAB_00b53a0b;
      *puVar11 = 0;
    }
  }
  else {
    if ((TVar2 & ErrorOnNew) != None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                  ,0x110,
                                  "((info->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0)"
                                  ,
                                  "Why are we trying to disable construction of a function that already isn\'t constructable?"
                                 );
      if (!bVar5) goto LAB_00b53a0b;
      *puVar11 = 0;
    }
    pTVar1 = &pFVar3->attributes;
    *(undefined1 *)pTVar1 = (char)*pTVar1 | ErrorOnNew;
    iVar6 = (**(code **)(**(long **)((scriptFunction->super_ScriptFunctionBase).
                                     super_JavascriptFunction.super_DynamicObject.
                                     super_RecyclableObject.type.ptr + 1) + 0x268))();
    uVar16 = local_34;
    if (iVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                  ,0x116,
                                  "(scriptFunction->GetDynamicType()->GetTypeHandler()->IsDeferredTypeHandler())"
                                  ,
                                  "scriptFunction->GetDynamicType()->GetTypeHandler()->IsDeferredTypeHandler()"
                                 );
      if (!bVar5) goto LAB_00b53a0b;
      *puVar11 = 0;
    }
    typeHandler = JavascriptLibrary::GetDeferredFunctionWithLengthTypeHandler
                            (*(JavascriptLibrary **)((long)existingName + 8));
    DynamicTypeHandler::SetInstanceTypeHandler((DynamicObject *)scriptFunction,typeHandler,true);
  }
  cVar15 = (char)uVar16;
  if (isPublic) {
    iVar6 = (*(displayName->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(displayName);
    string = (char16_t *)CONCAT44(extraout_var,iVar6);
    cVar7 = JavascriptString::GetLength(displayName);
    pcVar12 = PAL_wcsrchr(string,L'.');
    content = pcVar12 + 1;
    uVar17 = (long)content - (long)string;
    if (pcVar12 == (char16_t *)0x0) {
      content = (char16 *)0x0;
    }
    uVar17 = uVar17 >> 1 & 0xffffffff;
    if (pcVar12 == (char16_t *)0x0) {
      uVar17 = 0;
    }
    pFVar10 = ScriptFunction::GetFunctionProxy(scriptFunction);
    pPVar13 = FunctionProxy::EnsureDeserialized(pFVar10);
    (*(pPVar13->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[6])(pPVar13,string,(ulong)cVar7,uVar17);
    local_48 = (Var)0x0;
    BVar8 = JavascriptOperators::GetOwnProperty
                      (scriptFunction,0x106,&local_48,(ScriptContext *)existingName,
                       (PropertyValueInfo *)0x0);
    if (BVar8 != 0) {
      this = VarTo<Js::JavascriptString>(local_48);
      cVar9 = JavascriptString::GetLength(this);
      if (cVar9 == 0) {
        local_48 = (Var)0x0;
      }
    }
    if ((local_48 == (Var)0x0) || (BVar8 = JavascriptOperators::IsUndefined(local_48), BVar8 != 0))
    {
      if (content != (char16 *)0x0) {
        displayName = JavascriptString::NewCopyBuffer
                                (content,cVar7 - (int)uVar17,(ScriptContext *)existingName);
      }
      (*(scriptFunction->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
        super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x1e])(scriptFunction,0x106,displayName,2,0,0,0xf);
    }
    pFVar10 = ScriptFunction::GetFunctionProxy(scriptFunction);
    pFVar10->field_0x44 = pFVar10->field_0x44 | 4;
    cVar15 = (char)local_34;
  }
  if (cVar15 != '\0') {
    pFVar10 = ScriptFunction::GetFunctionProxy(scriptFunction);
    pFVar10->field_0x44 = pFVar10->field_0x44 | 8;
    ScriptFunction::SetEnvironment(scriptFunction,(FrameDisplay *)&StrictNullFrameDisplay);
    pFVar10 = ScriptFunction::GetFunctionProxy(scriptFunction);
    FunctionProxy::EnsureDeserialized(pFVar10);
    bVar5 = ScriptFunction::HasFunctionBody(scriptFunction);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                  ,0x157,"(scriptFunction->HasFunctionBody())",
                                  "scriptFunction->HasFunctionBody()");
      if (!bVar5) {
LAB_00b53a0b:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar11 = 0;
    }
    pFVar14 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)scriptFunction);
    pFVar14->field_0x17d = pFVar14->field_0x17d | 4;
  }
  return scriptFunction;
}

Assistant:

ScriptFunction *EngineInterfaceObject::CreateLibraryCodeScriptFunction(ScriptFunction *scriptFunction, JavascriptString *displayName, bool isConstructor, bool isJsBuiltIn, bool isPublic)
    {
        if (scriptFunction->GetFunctionProxy()->IsPublicLibraryCode())
        {
            // this can happen when we re-initialize Intl for a different mode -- for instance, if we have the following JS:
            // print((1).toLocaleString())
            // print(new Intl.NumberFormat().format(1))
            // Intl will first get initialized for Number, and then will get re-initialized for all of Intl. This will cause
            // Number.prototype.toLocaleString to be registered twice, which breaks some of our assertions below.
            return scriptFunction;
        }

        ScriptContext *scriptContext = scriptFunction->GetScriptContext();

        if (!isConstructor)
        {
            // set the ErrorOnNew attribute to disallow construction. JsBuiltIn/Intl functions are usually regular ScriptFunctions
            // (not lambdas or class methods), so they are usually constructable by default.
            FunctionInfo *info = scriptFunction->GetFunctionInfo();
            AssertMsg((info->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0, "Why are we trying to disable construction of a function that already isn't constructable?");
            info->SetAttributes((FunctionInfo::Attributes) (info->GetAttributes() | FunctionInfo::Attributes::ErrorOnNew));

            // Assert that the type handler is deferred to ensure that we aren't overwriting previous modifications.
            // Script functions start with deferred type handlers, which undefer as soon as any property is modified.
            // Since the function that is passed in should be an inline function expression, its type should still be deferred by the time it gets here.
            AssertOrFailFast(scriptFunction->GetDynamicType()->GetTypeHandler()->IsDeferredTypeHandler());

            // give the function a type handler with name and length but without prototype
            DynamicTypeHandler::SetInstanceTypeHandler(scriptFunction, scriptContext->GetLibrary()->GetDeferredFunctionWithLengthTypeHandler());
        }
        else
        {
            AssertMsg((scriptFunction->GetFunctionInfo()->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0, "Why is the function not constructable by default?");
        }

        if (isPublic)
        {
            // Use GetSz rather than GetString because we use wcsrchr below, which expects a null-terminated string
            // Callers can pass in a string like "get compare" or "Intl.Collator.prototype.resolvedOptions" -- only for the
            // latter do we extract a shortName.
            const char16 *methodNameBuf = displayName->GetSz();
            charcount_t methodNameLength = displayName->GetLength();
            const char16 *shortName = wcsrchr(methodNameBuf, _u('.'));
            charcount_t shortNameOffset = 0;
            if (shortName != nullptr)
            {
                shortName++;
                shortNameOffset = static_cast<charcount_t>(shortName - methodNameBuf);
            }

            scriptFunction->GetFunctionProxy()->EnsureDeserialized()->SetDisplayName(methodNameBuf, methodNameLength, shortNameOffset);

            // handle the name property AFTER handling isConstructor, because this can initialize the function's deferred type
            Var existingName = nullptr;
            if (JavascriptOperators::GetOwnProperty(scriptFunction, PropertyIds::name, &existingName, scriptContext, nullptr))
            {
                JavascriptString *existingNameString = VarTo<JavascriptString>(existingName);
                if (existingNameString->GetLength() == 0)
                {
                    // Only overwrite the name of the function object if it was anonymous coming in
                    // If the input function was named, it is likely intentional
                    existingName = nullptr;
                }
            }

            if (existingName == nullptr || JavascriptOperators::IsUndefined(existingName))
            {
                // It is convenient to set the name here rather than in script, since it is often duplicated.
                JavascriptString *funcName = displayName;
                if (shortName)
                {
                    funcName = JavascriptString::NewCopyBuffer(shortName, methodNameLength - shortNameOffset, scriptContext);
                }

                scriptFunction->SetPropertyWithAttributes(PropertyIds::name, funcName, PropertyConfigurable, nullptr);
            }

            scriptFunction->GetFunctionProxy()->SetIsPublicLibraryCode();
        }

        if (isJsBuiltIn)
        {
            scriptFunction->GetFunctionProxy()->SetIsJsBuiltInCode();

            // This makes it so that the given scriptFunction can't reference/close over any outside variables,
            // which is desirable for JsBuiltIns (though currently not for Intl)
            scriptFunction->SetEnvironment(const_cast<FrameDisplay *>(&StrictNullFrameDisplay));

            // TODO(jahorto): investigate force-inlining Intl code
            scriptFunction->GetFunctionProxy()->EnsureDeserialized();
            AssertOrFailFast(scriptFunction->HasFunctionBody());
            scriptFunction->GetFunctionBody()->SetJsBuiltInForceInline();
        }

        return scriptFunction;
    }